

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_heuristics.cpp
# Opt level: O2

idx_t duckdb::ExpressionHeuristics::ExpressionCost(BoundCastExpression *expr)

{
  LogicalType *this;
  bool bVar1;
  type expr_00;
  idx_t iVar2;
  long lVar3;
  LogicalType local_50;
  LogicalType local_38;
  
  this = &(expr->super_Expression).return_type;
  BoundCastExpression::source_type(&local_50,expr);
  bVar1 = LogicalType::operator!=(this,&local_50);
  LogicalType::~LogicalType(&local_50);
  if (bVar1) {
    if (this->id_ != VARCHAR) {
      BoundCastExpression::source_type(&local_50,expr);
      if ((local_50.id_ == VARCHAR) || ((expr->super_Expression).return_type.id_ == BLOB)) {
        LogicalType::~LogicalType(&local_50);
      }
      else {
        BoundCastExpression::source_type(&local_38,expr);
        LogicalType::~LogicalType(&local_38);
        LogicalType::~LogicalType(&local_50);
        if (local_38.id_ != BLOB) {
          lVar3 = 5;
          goto LAB_005994de;
        }
      }
    }
    lVar3 = 200;
  }
  else {
    lVar3 = 0;
  }
LAB_005994de:
  expr_00 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                      (&expr->child);
  iVar2 = Cost(expr_00);
  return iVar2 + lVar3;
}

Assistant:

idx_t ExpressionHeuristics::ExpressionCost(BoundCastExpression &expr) {
	// OPERATOR_CAST
	// determine cast cost by comparing cast_expr.source_type and cast_expr_target_type
	idx_t cast_cost = 0;
	if (expr.return_type != expr.source_type()) {
		// if cast from or to varchar
		// TODO: we might want to add more cases
		if (expr.return_type.id() == LogicalTypeId::VARCHAR || expr.source_type().id() == LogicalTypeId::VARCHAR ||
		    expr.return_type.id() == LogicalTypeId::BLOB || expr.source_type().id() == LogicalTypeId::BLOB) {
			cast_cost = 200;
		} else {
			cast_cost = 5;
		}
	}
	return Cost(*expr.child) + cast_cost;
}